

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree_color _Var4;
  char *__s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  const_iterator cVar6;
  long *plVar7;
  long *plVar8;
  TestFactoryBase *factory;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string message;
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  CodeLocation local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  long *local_168;
  long local_160;
  long local_158 [2];
  long *local_148;
  long local_140;
  long local_138 [2];
  int local_128;
  undefined1 local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  long *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _func_int **local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_80;
  
  UnitTest::GetInstance();
  p_Var9 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var10) {
    this_00 = &(UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_;
    psVar5 = &(UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_;
    local_b0 = this_00;
    do {
      paVar11 = &local_1b0.file.field_2;
      if (*(char *)&p_Var9[3]._M_parent == '\0') {
        __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
               *)(p_Var9 + 1);
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,(key_type *)__k);
        if ((_Rb_tree_header *)cVar6._M_node == &(psVar5->_M_t)._M_impl.super__Rb_tree_header) {
          std::operator+(&local_1d0,"Type parameterized test suite ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
          psVar1 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_1b0.file.field_2._M_allocated_capacity = *psVar1;
            local_1b0.file.field_2._8_8_ = plVar7[3];
            local_1b0.file._M_dataplus._M_p = (pointer)paVar11;
          }
          else {
            local_1b0.file.field_2._M_allocated_capacity = *psVar1;
            local_1b0.file._M_dataplus._M_p = (pointer)*plVar7;
          }
          paVar3 = &local_188.field_2;
          local_1b0.file._M_string_length = plVar7[1];
          *plVar7 = (long)psVar1;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1b0,*(ulong *)(p_Var9 + 1));
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar2) {
            local_188.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
            local_188.field_2._8_8_ = plVar7[3];
            local_188._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_188.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
            local_188._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_188._M_string_length = plVar7[1];
          *plVar7 = (long)paVar2;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_f0 = &local_e0;
          plVar7 = plVar8 + 2;
          if ((long *)*plVar8 == plVar7) {
            local_e0 = *plVar7;
            lStack_d8 = plVar8[3];
          }
          else {
            local_e0 = *plVar7;
            local_f0 = (long *)*plVar8;
          }
          local_e8 = plVar8[1];
          *plVar8 = (long)plVar7;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar3) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.file._M_dataplus._M_p != paVar11) {
            operator_delete(local_1b0.file._M_dataplus._M_p,
                            local_1b0.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_188,"UninstantiatedTypeParameterizedTestSuite<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_d0 = &local_c0;
          plVar7 = plVar8 + 2;
          if ((long *)*plVar8 == plVar7) {
            local_c0 = *plVar7;
            lStack_b8 = plVar8[3];
          }
          else {
            local_c0 = *plVar7;
            local_d0 = (long *)*plVar8;
          }
          local_c8 = plVar8[1];
          *plVar8 = (long)plVar7;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar3) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          local_a8 = local_d0;
          __s = *(char **)(p_Var9 + 2);
          _Var4 = p_Var9[3]._M_color;
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_f0,local_e8 + (long)local_f0);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_80,__k);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          local_118 = 0x16;
          local_1d0._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_118);
          local_1d0.field_2._M_allocated_capacity = local_118;
          builtin_strncpy(local_1d0._M_dataplus._M_p,"GoogleTestVerification",0x16);
          local_1d0._M_string_length = local_118;
          local_1d0._M_dataplus._M_p[local_118] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,__s,(allocator<char> *)&local_118);
          local_1b0.file._M_dataplus._M_p = (pointer)&local_1b0.file.field_2;
          if (local_110 == &local_100) {
            local_1b0.file.field_2._8_8_ = local_100._8_8_;
          }
          else {
            local_1b0.file._M_dataplus._M_p = (pointer)local_110;
          }
          local_1b0.file.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_
          ;
          local_1b0.file.field_2._M_local_buf[0] = local_100._M_local_buf[0];
          paVar11 = &local_188.field_2;
          local_1b0.file._M_string_length = local_108;
          local_108 = 0;
          local_100._M_local_buf[0] = '\0';
          local_1b0.line = _Var4;
          local_110 = &local_100;
          factory = (TestFactoryBase *)operator_new(0x78);
          if (local_a0 == &local_90) {
            local_188.field_2._12_4_ = local_90._12_4_;
            local_188.field_2._8_4_ = local_90._8_4_;
            local_188._M_dataplus._M_p = (pointer)paVar11;
          }
          else {
            local_188._M_dataplus._M_p = (pointer)local_a0;
          }
          local_188.field_2._M_allocated_capacity._4_4_ = local_90._M_allocated_capacity._4_4_;
          local_188.field_2._M_allocated_capacity._0_4_ = local_90._M_allocated_capacity._0_4_;
          local_188._M_string_length = (size_type)local_98;
          local_98 = (_func_int **)0x0;
          local_90._M_allocated_capacity._0_4_ = local_90._M_allocated_capacity._0_4_ & 0xffffff00;
          local_168 = local_158;
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_80.first._M_dataplus._M_p,
                     local_80.first._M_dataplus._M_p + local_80.first._M_string_length);
          local_148 = local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_80.second.code_location.file._M_dataplus._M_p,
                     local_80.second.code_location.file._M_dataplus._M_p +
                     local_80.second.code_location.file._M_string_length);
          this_00 = local_b0;
          local_128 = local_80.second.code_location.line;
          local_120 = local_80.second.instantiated;
          factory->_vptr_TestFactoryBase =
               (_func_int **)
               (
               _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
               + 0x10);
          factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == paVar11) {
            *(undefined4 *)&factory[3]._vptr_TestFactoryBase =
                 local_188.field_2._M_allocated_capacity._0_4_;
            *(undefined4 *)((long)&factory[3]._vptr_TestFactoryBase + 4) =
                 local_188.field_2._M_allocated_capacity._4_4_;
            *(undefined4 *)&factory[4]._vptr_TestFactoryBase = local_188.field_2._8_4_;
            *(undefined4 *)((long)&factory[4]._vptr_TestFactoryBase + 4) = local_188.field_2._12_4_;
          }
          else {
            factory[1]._vptr_TestFactoryBase = (_func_int **)local_188._M_dataplus._M_p;
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_188.field_2._M_allocated_capacity
            ;
          }
          factory[2]._vptr_TestFactoryBase = (_func_int **)local_188._M_string_length;
          local_188._M_string_length = 0;
          local_188.field_2._M_allocated_capacity =
               local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
          factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
          local_188._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(factory + 5),local_168,local_160 + (long)local_168);
          factory[9]._vptr_TestFactoryBase = (_func_int **)(factory + 0xb);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(factory + 9),local_148,local_140 + (long)local_148);
          *(int *)&factory[0xd]._vptr_TestFactoryBase = local_128;
          *(undefined1 *)&factory[0xe]._vptr_TestFactoryBase = local_120;
          MakeAndRegisterTestInfo
                    (&local_1d0,(char *)local_a8,(char *)0x0,(char *)0x0,&local_1b0,
                     &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                     (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
          if (local_148 != local_138) {
            operator_delete(local_148,local_138[0] + 1);
          }
          if (local_168 != local_158) {
            operator_delete(local_168,local_158[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.file._M_dataplus._M_p != &local_1b0.file.field_2) {
            operator_delete(local_1b0.file._M_dataplus._M_p,
                            local_1b0.file.field_2._M_allocated_capacity + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,
                            CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.second.code_location.file._M_dataplus._M_p !=
              &local_80.second.code_location.file.field_2) {
            operator_delete(local_80.second.code_location.file._M_dataplus._M_p,
                            local_80.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,CONCAT44(local_90._M_allocated_capacity._4_4_,
                                              local_90._M_allocated_capacity._0_4_) + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var10);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get "
        "other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following "
        "line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}